

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O0

void ncnn::binary_op_vector_no_broadcast<ncnn::BinaryOp_x86_avx512_functor::binary_op_add>
               (float *ptr,float *ptr1,float *outptr,int size)

{
  int in_ECX;
  float *in_RDX;
  undefined1 (*in_RSI) [64];
  undefined1 (*in_RDI) [64];
  undefined1 auVar1 [64];
  __m128 _outp_2;
  __m128 _b_2;
  __m128 _p_2;
  __m256 _outp_1;
  __m256 _b_1;
  __m256 _p_1;
  __m512 _outp;
  __m512 _b;
  __m512 _p;
  int i;
  binary_op_add op;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 uStack_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  int local_28c;
  float *local_280;
  undefined1 (*local_278) [64];
  undefined1 (*local_270) [64];
  float local_c0;
  float fStack_bc;
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  float fStack_a4;
  float local_a0;
  float fStack_9c;
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  float local_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  float local_60;
  float fStack_5c;
  float fStack_58;
  float fStack_54;
  
  local_280 = in_RDX;
  local_278 = in_RSI;
  local_270 = in_RDI;
  for (local_28c = 0; local_28c + 0xf < in_ECX; local_28c = local_28c + 0x10) {
    auVar1 = vaddps_avx512f(*local_270,*local_278);
    local_380 = auVar1._0_8_;
    uStack_378 = auVar1._8_8_;
    uStack_370 = auVar1._16_8_;
    uStack_368 = auVar1._24_8_;
    uStack_360 = auVar1._32_8_;
    uStack_358 = auVar1._40_8_;
    uStack_350 = auVar1._48_8_;
    uStack_348 = auVar1._56_8_;
    *(undefined8 *)local_280 = local_380;
    *(undefined8 *)(local_280 + 2) = uStack_378;
    *(undefined8 *)(local_280 + 4) = uStack_370;
    *(undefined8 *)(local_280 + 6) = uStack_368;
    *(undefined8 *)(local_280 + 8) = uStack_360;
    *(undefined8 *)(local_280 + 10) = uStack_358;
    *(undefined8 *)(local_280 + 0xc) = uStack_350;
    *(undefined8 *)(local_280 + 0xe) = uStack_348;
    local_270 = local_270 + 1;
    local_278 = local_278 + 1;
    local_280 = local_280 + 0x10;
  }
  for (; local_28c + 7 < in_ECX; local_28c = local_28c + 8) {
    local_a0 = (float)*(undefined8 *)*local_270;
    fStack_9c = (float)((ulong)*(undefined8 *)*local_270 >> 0x20);
    fStack_98 = (float)*(undefined8 *)(*local_270 + 8);
    fStack_94 = (float)((ulong)*(undefined8 *)(*local_270 + 8) >> 0x20);
    fStack_90 = (float)*(undefined8 *)(*local_270 + 0x10);
    fStack_8c = (float)((ulong)*(undefined8 *)(*local_270 + 0x10) >> 0x20);
    fStack_88 = (float)*(undefined8 *)(*local_270 + 0x18);
    fStack_84 = (float)((ulong)*(undefined8 *)(*local_270 + 0x18) >> 0x20);
    local_c0 = (float)*(undefined8 *)*local_278;
    fStack_bc = (float)((ulong)*(undefined8 *)*local_278 >> 0x20);
    fStack_b8 = (float)*(undefined8 *)(*local_278 + 8);
    fStack_b4 = (float)((ulong)*(undefined8 *)(*local_278 + 8) >> 0x20);
    fStack_b0 = (float)*(undefined8 *)(*local_278 + 0x10);
    fStack_ac = (float)((ulong)*(undefined8 *)(*local_278 + 0x10) >> 0x20);
    fStack_a8 = (float)*(undefined8 *)(*local_278 + 0x18);
    fStack_a4 = (float)((ulong)*(undefined8 *)(*local_278 + 0x18) >> 0x20);
    *(ulong *)local_280 = CONCAT44(fStack_9c + fStack_bc,local_a0 + local_c0);
    *(ulong *)(local_280 + 2) = CONCAT44(fStack_94 + fStack_b4,fStack_98 + fStack_b8);
    *(ulong *)(local_280 + 4) = CONCAT44(fStack_8c + fStack_ac,fStack_90 + fStack_b0);
    *(ulong *)(local_280 + 6) = CONCAT44(fStack_84 + fStack_a4,fStack_88 + fStack_a8);
    local_270 = (undefined1 (*) [64])(*local_270 + 0x20);
    local_278 = (undefined1 (*) [64])(*local_278 + 0x20);
    local_280 = local_280 + 8;
  }
  for (; local_28c + 3 < in_ECX; local_28c = local_28c + 4) {
    local_60 = (float)*(undefined8 *)*local_270;
    fStack_5c = (float)((ulong)*(undefined8 *)*local_270 >> 0x20);
    fStack_58 = (float)*(undefined8 *)(*local_270 + 8);
    fStack_54 = (float)((ulong)*(undefined8 *)(*local_270 + 8) >> 0x20);
    local_70 = (float)*(undefined8 *)*local_278;
    fStack_6c = (float)((ulong)*(undefined8 *)*local_278 >> 0x20);
    fStack_68 = (float)*(undefined8 *)(*local_278 + 8);
    fStack_64 = (float)((ulong)*(undefined8 *)(*local_278 + 8) >> 0x20);
    *(ulong *)local_280 = CONCAT44(fStack_5c + fStack_6c,local_60 + local_70);
    *(ulong *)(local_280 + 2) = CONCAT44(fStack_54 + fStack_64,fStack_58 + fStack_68);
    local_270 = (undefined1 (*) [64])(*local_270 + 0x10);
    local_278 = (undefined1 (*) [64])(*local_278 + 0x10);
    local_280 = local_280 + 4;
  }
  for (; local_28c < in_ECX; local_28c = local_28c + 1) {
    *local_280 = *(float *)*local_270 + *(float *)*local_278;
    local_270 = (undefined1 (*) [64])(*local_270 + 4);
    local_278 = (undefined1 (*) [64])(*local_278 + 4);
    local_280 = local_280 + 1;
  }
  return;
}

Assistant:

static void binary_op_vector_no_broadcast(const float* ptr, const float* ptr1, float* outptr, int size)
{
    const Op op;

    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
    for (; i + 15 < size; i += 16)
    {
        __m512 _p = _mm512_loadu_ps(ptr);
        __m512 _b = _mm512_loadu_ps(ptr1);
        __m512 _outp = op.func_pack16(_p, _b);
        _mm512_storeu_ps(outptr, _outp);
        ptr += 16;
        ptr1 += 16;
        outptr += 16;
    }
#endif // __AVX512F__
    for (; i + 7 < size; i += 8)
    {
        __m256 _p = _mm256_loadu_ps(ptr);
        __m256 _b = _mm256_loadu_ps(ptr1);
        __m256 _outp = op.func_pack8(_p, _b);
        _mm256_storeu_ps(outptr, _outp);
        ptr += 8;
        ptr1 += 8;
        outptr += 8;
    }
#endif // __AVX__
    for (; i + 3 < size; i += 4)
    {
        __m128 _p = _mm_loadu_ps(ptr);
        __m128 _b = _mm_loadu_ps(ptr1);
        __m128 _outp = op.func_pack4(_p, _b);
        _mm_storeu_ps(outptr, _outp);
        ptr += 4;
        ptr1 += 4;
        outptr += 4;
    }
#endif // __SSE2__
    for (; i < size; i++)
    {
        *outptr = op.func(*ptr, *ptr1);
        ptr += 1;
        ptr1 += 1;
        outptr += 1;
    }
}